

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

void train_body_armor_skill(void)

{
  obj *poVar1;
  boolean bVar2;
  
  poVar1 = uarm;
  if (uarm != (obj *)0x0) {
    bVar2 = donning_on(uarm);
    if (bVar2 == '\0') {
      if ((uint)objects[0x77].oc_weight <= poVar1->owt) {
        train_skill_over_time
                  (0x28,poVar1->owt,&u.uarmortrain,16000,24000,(uint)objects[0x77].oc_weight,
                   (uint)objects[0x6a].oc_weight);
      }
    }
  }
  return;
}

Assistant:

void train_body_armor_skill(void)
{
    if (uarm && !donning_on(uarm) && uarm->owt >= P_BODY_ARMOR_MIN_WEIGHT) {
	train_skill_over_time(
		P_BODY_ARMOR,
		uarm->owt,
		&u.uarmortrain,
		16000,
		24000,
		P_BODY_ARMOR_MIN_WEIGHT,
		objects[PLATE_MAIL].oc_weight);
    }
}